

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Functions.c
# Opt level: O3

double Jupiter_strtod_nospace(char *str)

{
  byte *pbVar1;
  int iVar2;
  ulong uVar3;
  byte bVar4;
  double dVar5;
  double dVar6;
  
  bVar4 = *str;
  if (bVar4 == 0x2b) {
    bVar4 = str[1];
    str = str + 1;
  }
  else if (bVar4 == 0x2d) {
    dVar5 = Jupiter_strtod_nospace(str + 1);
    return -dVar5;
  }
  dVar5 = 0.0;
  while (0xfffffffffffffff5 < (ulong)bVar4 - 0x3a) {
    dVar5 = dVar5 * 10.0 +
            (double)"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f"
                    [bVar4];
    pbVar1 = (byte *)(str + 1);
    str = str + 1;
    bVar4 = *pbVar1;
  }
  if (bVar4 == 0x2e) {
    bVar4 = str[1];
    uVar3 = (ulong)bVar4;
    if (0xfffffffffffffff5 < uVar3 - 0x3a) {
      iVar2 = 10;
      do {
        dVar5 = dVar5 + (double)"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f"
                                [uVar3] / (double)iVar2;
        iVar2 = iVar2 * 10;
        bVar4 = str[2];
        uVar3 = (ulong)bVar4;
        str = str + 1;
      } while (0xfffffffffffffff5 < uVar3 - 0x3a);
    }
    if ((bVar4 | 0x20) == 0x65) {
      iVar2 = Jupiter_strtoi_nospace(str + 2,10);
      dVar6 = pow(10.0,(double)iVar2);
      dVar5 = dVar5 * dVar6;
    }
  }
  return dVar5;
}

Assistant:

double Jupiter_strtod_nospace(const char *str)
{
	const int base = 10;
	double total = 0.0;
	double decimal = 0.0;
	int tval;

	if (*str == '-')
		return -1 * Jupiter_strtod_nospace(++str);

	if (*str == '+')
		++str;

	while ((tval = Jupiter_getBase(*str, base)) != -1)
	{
		total = base * total + tval;
		++str;
	}

	if (*str == '.')
	{
		++str;
		tval = base;
		while ((decimal = Jupiter_getBase(*str, base)) != -1)
		{
			total = total + (decimal / tval);
			++str;
			tval = tval * base;
		}
		if (*str == 'e' || *str == 'E')
			total = total * pow(base, Jupiter_strtoi_nospace(++str, 10));
	}

	return total;
}